

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O3

ArgConvertResult<(absl::lts_20240722::FormatConversionCharSet)262144>
absl::lts_20240722::str_format_internal::FormatConvertImpl
          (string_view v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  
  if (conv.flags_ == kBasic) {
    FormatSinkImpl::Append(sink,v);
    bVar1 = true;
  }
  else {
    bVar1 = FormatSinkImpl::PutPaddedString
                      (sink,v,conv.width_,conv.precision_,(bool)(conv.flags_ & kLeft));
  }
  return (ArgConvertResult<(absl::lts_20240722::FormatConversionCharSet)262144>)bVar1;
}

Assistant:

StringConvertResult FormatConvertImpl(string_view v,
                                      const FormatConversionSpecImpl conv,
                                      FormatSinkImpl *sink) {
  return {ConvertStringArg(v, conv, sink)};
}